

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

EnumValueDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown
          (FileDescriptorTables *this,EnumDescriptor *parent,int number)

{
  EnumValueDescriptor *this_00;
  FileDescriptorTables *pFVar1;
  undefined8 uVar2;
  DescriptorPool *pDVar3;
  string *psVar4;
  EnumValueOptions *pEVar5;
  pair<const_google::protobuf::EnumDescriptor_*,_int> pVar6;
  first_type local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  FileDescriptorTables *local_f8;
  EnumValueDescriptor *result;
  Tables *tables;
  string enum_value_name;
  first_type local_b8;
  FileDescriptorTables *local_a8;
  EnumValueDescriptor *desc_2;
  WriterMutexLock l_1;
  first_type local_70;
  FileDescriptorTables *local_60;
  EnumValueDescriptor *desc_1;
  ReaderMutexLock l;
  first_type local_40;
  FileDescriptorTables *local_30;
  EnumValueDescriptor *desc;
  EnumDescriptor *pEStack_20;
  int number_local;
  EnumDescriptor *parent_local;
  FileDescriptorTables *this_local;
  
  desc._4_4_ = number;
  pEStack_20 = parent;
  parent_local = (EnumDescriptor *)this;
  pVar6 = std::make_pair<google::protobuf::EnumDescriptor_const*&,int&>
                    (&stack0xffffffffffffffe0,(int *)((long)&desc + 4));
  l.mu_ = (Mutex *)pVar6.first;
  local_40.second = pVar6.second;
  local_40.first = (EnumDescriptor *)l.mu_;
  local_30 = (FileDescriptorTables *)
             FindPtrOrNull<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                       (&this->enum_values_by_number_,&local_40);
  pFVar1 = local_30;
  if (local_30 == (FileDescriptorTables *)0x0) {
    internal::MutexLock::MutexLock((MutexLock *)&desc_1,&this->unknown_enum_values_mu_);
    pVar6 = std::make_pair<google::protobuf::EnumDescriptor_const*&,int&>
                      (&stack0xffffffffffffffe0,(int *)((long)&desc + 4));
    local_70.first = pVar6.first;
    local_70.second = pVar6.second;
    local_60 = (FileDescriptorTables *)
               FindPtrOrNull<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                         (&this->unknown_enum_values_by_number_,&local_70);
    if (local_60 != (FileDescriptorTables *)0x0) {
      this_local = local_60;
    }
    l_1.mu_._5_3_ = 0;
    l_1.mu_._4_1_ = local_60 != (FileDescriptorTables *)0x0;
    internal::MutexLock::~MutexLock((MutexLock *)&desc_1);
    pFVar1 = this_local;
    if (l_1.mu_._4_4_ == 0) {
      internal::MutexLock::MutexLock((MutexLock *)&desc_2,&this->unknown_enum_values_mu_);
      pVar6 = std::make_pair<google::protobuf::EnumDescriptor_const*&,int&>
                        (&stack0xffffffffffffffe0,(int *)((long)&desc + 4));
      enum_value_name.field_2._8_8_ = pVar6.first;
      local_b8.second = pVar6.second;
      local_b8.first = (EnumDescriptor *)enum_value_name.field_2._8_8_;
      local_a8 = (FileDescriptorTables *)
                 FindPtrOrNull<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                           (&this->unknown_enum_values_by_number_,&local_b8);
      if (local_a8 == (FileDescriptorTables *)0x0) {
        EnumDescriptor::name_abi_cxx11_(pEStack_20);
        uVar2 = std::__cxx11::string::c_str();
        StringPrintf_abi_cxx11_
                  ((string *)&tables,"UNKNOWN_ENUM_VALUE_%s_%d",uVar2,(ulong)desc._4_4_);
        pDVar3 = DescriptorPool::generated_pool();
        result = (EnumValueDescriptor *)
                 internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::get
                           (&pDVar3->tables_);
        local_f8 = (FileDescriptorTables *)
                   DescriptorPool::Tables::Allocate<google::protobuf::EnumValueDescriptor>
                             ((Tables *)result);
        psVar4 = DescriptorPool::Tables::AllocateString((Tables *)result,(string *)&tables);
        this_00 = result;
        (local_f8->symbols_by_parent_).
        super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>_>
        ._M_h._M_buckets = (__buckets_ptr)psVar4;
        psVar4 = EnumDescriptor::full_name_abi_cxx11_(pEStack_20);
        std::operator+(&local_138,psVar4,".");
        std::operator+(&local_118,&local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tables)
        ;
        psVar4 = DescriptorPool::Tables::AllocateString((Tables *)this_00,&local_118);
        (local_f8->symbols_by_parent_).
        super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>_>
        ._M_h._M_bucket_count = (size_type)psVar4;
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_138);
        *(uint *)&(local_f8->symbols_by_parent_).
                  super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>_>
                  ._M_h._M_before_begin._M_nxt = desc._4_4_;
        (local_f8->symbols_by_parent_).
        super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>_>
        ._M_h._M_element_count = (size_type)pEStack_20;
        pEVar5 = EnumValueOptions::default_instance();
        *(EnumValueOptions **)
         &(local_f8->symbols_by_parent_).
          super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>_>
          ._M_h._M_rehash_policy = pEVar5;
        pVar6 = std::make_pair<google::protobuf::EnumDescriptor_const*&,int&>
                          (&stack0xffffffffffffffe0,(int *)((long)&desc + 4));
        local_148.first = pVar6.first;
        local_148.second = pVar6.second;
        InsertIfNotPresent<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                  (&this->unknown_enum_values_by_number_,&local_148,(second_type *)&local_f8);
        this_local = local_f8;
        l_1.mu_._4_4_ = 1;
        std::__cxx11::string::~string((string *)&tables);
      }
      else {
        l_1.mu_._4_4_ = 1;
        this_local = local_a8;
      }
      internal::MutexLock::~MutexLock((MutexLock *)&desc_2);
      pFVar1 = this_local;
    }
  }
  this_local = pFVar1;
  return (EnumValueDescriptor *)this_local;
}

Assistant:

inline const EnumValueDescriptor*
FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown(
    const EnumDescriptor* parent, int number) const {
  // First try, with map of compiled-in values.
  {
    const EnumValueDescriptor* desc =
        FindPtrOrNull(enum_values_by_number_, std::make_pair(parent, number));
    if (desc != NULL) {
      return desc;
    }
  }
  // Second try, with reader lock held on unknown enum values: common case.
  {
    ReaderMutexLock l(&unknown_enum_values_mu_);
    const EnumValueDescriptor* desc = FindPtrOrNull(
        unknown_enum_values_by_number_, std::make_pair(parent, number));
    if (desc != NULL) {
      return desc;
    }
  }
  // If not found, try again with writer lock held, and create new descriptor if
  // necessary.
  {
    WriterMutexLock l(&unknown_enum_values_mu_);
    const EnumValueDescriptor* desc = FindPtrOrNull(
        unknown_enum_values_by_number_, std::make_pair(parent, number));
    if (desc != NULL) {
      return desc;
    }

    // Create an EnumValueDescriptor dynamically. We don't insert it into the
    // EnumDescriptor (it's not a part of the enum as originally defined), but
    // we do insert it into the table so that we can return the same pointer
    // later.
    string enum_value_name = StringPrintf(
        "UNKNOWN_ENUM_VALUE_%s_%d", parent->name().c_str(), number);
    DescriptorPool::Tables* tables =
        const_cast<DescriptorPool::Tables*>(DescriptorPool::generated_pool()->
                                            tables_.get());
    EnumValueDescriptor* result = tables->Allocate<EnumValueDescriptor>();
    result->name_ = tables->AllocateString(enum_value_name);
    result->full_name_ = tables->AllocateString(parent->full_name() +
                                                "." + enum_value_name);
    result->number_ = number;
    result->type_ = parent;
    result->options_ = &EnumValueOptions::default_instance();
    InsertIfNotPresent(&unknown_enum_values_by_number_,
                       std::make_pair(parent, number), result);
    return result;
  }
}